

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O0

ssize_t __thiscall Disk::write(Disk *this,int __fd,void *__buf,size_t __n)

{
  mapped_type *pmVar1;
  undefined4 in_register_00000034;
  CylHead local_28;
  CylHead cylhead;
  lock_guard<std::mutex> lock;
  TrackData *trackdata_local;
  Disk *this_local;
  
  (this->fmt).sectors = 0;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&cylhead,&this->m_trackdata_mutex);
  local_28 = ((TrackData *)CONCAT44(in_register_00000034,__fd))->cylhead;
  pmVar1 = std::
           map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
           ::operator[](&this->m_trackdata,&local_28);
  TrackData::operator=(pmVar1,(TrackData *)CONCAT44(in_register_00000034,__fd));
  pmVar1 = std::
           map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
           ::operator[](&this->m_trackdata,&local_28);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&cylhead);
  return (ssize_t)pmVar1;
}

Assistant:

const TrackData& Disk::write(TrackData&& trackdata)
{
    // Invalidate stored format, since we can no longer guarantee a match
    fmt.sectors = 0;

    std::lock_guard<std::mutex> lock(m_trackdata_mutex);
    auto cylhead = trackdata.cylhead;
    m_trackdata[cylhead] = std::move(trackdata);
    return m_trackdata[cylhead];
}